

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_Question_clear(HTS_Question *question)

{
  HTS_Question *in_RDI;
  HTS_Pattern *next_pattern;
  HTS_Pattern *pattern;
  HTS_Pattern *local_10;
  
  if (in_RDI->string != (char *)0x0) {
    HTS_free((void *)0x193b31);
  }
  local_10 = in_RDI->head;
  while (local_10 != (HTS_Pattern *)0x0) {
    local_10 = local_10->next;
    HTS_free((void *)0x193b61);
    HTS_free((void *)0x193b6b);
  }
  HTS_Question_initialize(in_RDI);
  return;
}

Assistant:

static void HTS_Question_clear(HTS_Question * question)
{
   HTS_Pattern *pattern, *next_pattern;

   if (question->string != NULL)
      HTS_free(question->string);
   for (pattern = question->head; pattern; pattern = next_pattern) {
      next_pattern = pattern->next;
      HTS_free(pattern->string);
      HTS_free(pattern);
   }
   HTS_Question_initialize(question);
}